

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O3

QImage * __thiscall
QFontEngineFT::alphaMapForGlyph
          (QImage *__return_storage_ptr__,QFontEngineFT *this,glyph_t g,
          QFixedPoint *subPixelPosition,QTransform *t)

{
  ushort uVar1;
  ushort uVar2;
  QColor color;
  QImageData *pQVar3;
  TransformationType TVar4;
  QRgb c;
  Glyph *pGVar5;
  byte bVar6;
  bool bVar7;
  long in_FS_OFFSET;
  undefined8 local_98;
  undefined8 uStack_90;
  QImage local_80;
  undefined4 local_68;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined6 uStack_60;
  ushort uStack_5a;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->freetype->face->face_flags & 1) == 0) {
    TVar4 = QTransform::type(t);
    bVar7 = 1 < (int)TVar4;
  }
  else {
    bVar7 = false;
  }
  bVar6 = this->antialias | bVar7;
  local_68 = 0;
  uStack_64 = 0xffff;
  uStack_62 = 0;
  uStack_60 = 0;
  color._8_8_ = (ulong)uStack_5a << 0x30;
  color._0_8_ = 0xffff00000000;
  pGVar5 = loadGlyphFor(this,g,subPixelPosition,bVar6 + Format_Mono,t,color,false,true);
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  if (((pGVar5 == (Glyph *)0x0) || (uVar1 = pGVar5->height, uVar1 == 0)) ||
     (uVar2 = pGVar5->width, uVar2 == 0)) {
    QImage::QImage(__return_storage_ptr__);
  }
  else if (bVar6 == 0) {
    __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(__return_storage_ptr__,pGVar5->data,(uint)uVar2,(uint)uVar1,
                   (ulong)(uVar2 + 0x1f >> 3 & 0xfffffffc),Format_Mono,(QImageCleanupFunction)0x0,
                   (void *)0x0);
    QColor::QColor((QColor *)local_58,white);
    c = QColor::rgba((QColor *)local_58);
    QImage::setColor(__return_storage_ptr__,1,c);
  }
  else {
    __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(__return_storage_ptr__,pGVar5->data,(uint)uVar2,(uint)uVar1,
                   (ulong)(uVar2 + 3 & 0xfffffffc),Format_Alpha8,(QImageCleanupFunction)0x0,
                   (void *)0x0);
  }
  if (bVar7 == false) {
    local_98 = 0;
    uStack_90 = 0xffffffffffffffff;
    QImage::copy(&local_80,(EVP_PKEY_CTX *)__return_storage_ptr__,(EVP_PKEY_CTX *)&local_98);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    pQVar3 = local_80.d;
    local_58._0_8_ = &PTR__QImage_007d1ec8;
    local_80.d = (QImageData *)0x0;
    local_48 = __return_storage_ptr__->d;
    __return_storage_ptr__->d = pQVar3;
    QImage::~QImage((QImage *)local_58);
  }
  else {
    QImage::transformed(&local_80,__return_storage_ptr__,t,FastTransformation);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    pQVar3 = local_80.d;
    local_58._0_8_ = &PTR__QImage_007d1ec8;
    local_80.d = (QImageData *)0x0;
    local_48 = __return_storage_ptr__->d;
    __return_storage_ptr__->d = pQVar3;
    QImage::~QImage((QImage *)local_58);
  }
  QImage::~QImage(&local_80);
  if ((pGVar5 != &emptyGlyph) && (this->cacheEnabled == false)) {
    if ((pGVar5 != (Glyph *)0x0) && (pGVar5->data != (uchar *)0x0)) {
      operator_delete__(pGVar5->data);
    }
    operator_delete(pGVar5,0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngineFT::alphaMapForGlyph(glyph_t g,
                                       const QFixedPoint &subPixelPosition,
                                       const QTransform &t)
{
    const bool needsImageTransform = !FT_IS_SCALABLE(freetype->face)
            && t.type() > QTransform::TxTranslate;
    const GlyphFormat neededFormat = antialias || needsImageTransform ? Format_A8 : Format_Mono;

    Glyph *glyph = loadGlyphFor(g, subPixelPosition, neededFormat, t, QColor(), false, true);

    QImage img = alphaMapFromGlyphData(glyph, neededFormat);
    if (needsImageTransform)
        img = img.transformed(t, Qt::FastTransformation);
    else
        img = img.copy();

    if (!cacheEnabled && glyph != &emptyGlyph)
        delete glyph;

    return img;
}